

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

int list_txt_files(char *dir_path,char ***file_names)

{
  int iVar1;
  char ***file_names_local;
  char *dir_path_local;
  
  iVar1 = __list_txt_files__unix(dir_path,file_names);
  return iVar1;
}

Assistant:

int list_txt_files(const char *dir_path, char ***file_names) {
    #ifdef __unix__
        return __list_txt_files__unix(dir_path, file_names);
    #endif
    #ifdef _WIN32
        return __list_txt_files__win(dir_path, file_names);
    #endif
    return -1;
}